

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_mull_32_i(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar1 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar2 = m68k_read_memory_32(uVar7 & m68ki_cpu.address_mask);
  uVar5 = uVar1 >> 0xc & 7;
  m68ki_cpu.c_flag = 0;
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar4 = (ulong)uVar2 * (ulong)m68ki_cpu.dar[uVar5];
    if ((uVar1 >> 10 & 1) == 0) {
      m68ki_cpu.n_flag = (uint)(uVar4 >> 0x18);
      m68ki_cpu.v_flag = (uint)(uVar4 >> 0x20 != 0) << 7;
      m68ki_cpu.not_z_flag = (uint)uVar4;
    }
    else {
      uVar2 = (uint)(uVar4 >> 0x20);
      m68ki_cpu.not_z_flag = uVar2 | (uint)uVar4;
      m68ki_cpu.n_flag = (uint)(byte)(uVar4 >> 0x38);
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.dar[uVar1 & 7] = uVar2;
    }
  }
  else {
    uVar6 = (long)(int)m68ki_cpu.dar[uVar5] * (long)(int)uVar2;
    uVar2 = (uint)uVar6;
    if ((uVar1 >> 10 & 1) != 0) {
      uVar3 = (uint)(uVar6 >> 0x20);
      m68ki_cpu.not_z_flag = uVar3 | uVar2;
      m68ki_cpu.n_flag = (uint)(byte)(uVar6 >> 0x38);
      m68ki_cpu.v_flag = 0;
      m68ki_cpu.dar[uVar1 & 7] = uVar3;
      m68ki_cpu.dar[uVar5] = uVar2;
      return;
    }
    m68ki_cpu.n_flag = (uint)(uVar6 >> 0x18);
    uVar4 = (ulong)(int)uVar2;
    m68ki_cpu.v_flag = (uint)(uVar4 != uVar6) << 7;
    m68ki_cpu.not_z_flag = uVar2;
  }
  m68ki_cpu.dar[uVar5] = (uint)uVar4;
  return;
}

Assistant:

static void m68k_op_mull_32_i(void)
{
#if M68K_USE_64_BIT

	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint64 src = OPER_I_32();
		uint64 dst = REG_D[(word2 >> 12) & 7];
		uint64 res;

		FLAG_C = CFLAG_CLEAR;

		if(BIT_B(word2))			   /* signed */
		{
			res = (sint64)((sint32)src) * (sint64)((sint32)dst);
			if(!BIT_A(word2))
			{
				FLAG_Z = MASK_OUT_ABOVE_32(res);
				FLAG_N = NFLAG_32(res);
				FLAG_V = ((sint64)res != (sint32)res)<<7;
				REG_D[(word2 >> 12) & 7] = FLAG_Z;
				return;
			}
			FLAG_Z = MASK_OUT_ABOVE_32(res) | (res>>32);
			FLAG_N = NFLAG_64(res);
			FLAG_V = VFLAG_CLEAR;
			REG_D[word2 & 7] = (res >> 32);
			REG_D[(word2 >> 12) & 7] = MASK_OUT_ABOVE_32(res);
			return;
		}

		res = src * dst;
		if(!BIT_A(word2))
		{
			FLAG_Z = MASK_OUT_ABOVE_32(res);
			FLAG_N = NFLAG_32(res);
			FLAG_V = (res > 0xffffffff)<<7;
			REG_D[(word2 >> 12) & 7] = FLAG_Z;
			return;
		}
		FLAG_Z = MASK_OUT_ABOVE_32(res) | (res>>32);
		FLAG_N = NFLAG_64(res);
		FLAG_V = VFLAG_CLEAR;
		REG_D[word2 & 7] = (res >> 32);
		REG_D[(word2 >> 12) & 7] = MASK_OUT_ABOVE_32(res);
		return;
	}
	m68ki_exception_illegal();

#else

	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint src = OPER_I_32();
		uint dst = REG_D[(word2 >> 12) & 7];
		uint neg = GET_MSB_32(src ^ dst);
		uint src1;
		uint src2;
		uint dst1;
		uint dst2;
		uint r1;
		uint r2;
		uint r3;
		uint r4;
		uint lo;
		uint hi;

		FLAG_C = CFLAG_CLEAR;

		if(BIT_B(word2))			   /* signed */
		{
			if(GET_MSB_32(src))
				src = (uint)MASK_OUT_ABOVE_32(-(sint)src);
			if(GET_MSB_32(dst))
				dst = (uint)MASK_OUT_ABOVE_32(-(sint)dst);
		}

		src1 = MASK_OUT_ABOVE_16(src);
		src2 = src>>16;
		dst1 = MASK_OUT_ABOVE_16(dst);
		dst2 = dst>>16;


		r1 = src1 * dst1;
		r2 = src1 * dst2;
		r3 = src2 * dst1;
		r4 = src2 * dst2;

		lo = r1 + (MASK_OUT_ABOVE_16(r2)<<16) + (MASK_OUT_ABOVE_16(r3)<<16);
		hi = r4 + (r2>>16) + (r3>>16) + (((r1>>16) + MASK_OUT_ABOVE_16(r2) + MASK_OUT_ABOVE_16(r3)) >> 16);

		if(BIT_B(word2) && neg)
		{
			hi = (uint)MASK_OUT_ABOVE_32((-(sint)hi) - (lo != 0));
			lo = (uint)MASK_OUT_ABOVE_32(-(sint)lo);
		}

		if(BIT_A(word2))
		{
			REG_D[word2 & 7] = hi;
			REG_D[(word2 >> 12) & 7] = lo;
			FLAG_N = NFLAG_32(hi);
			FLAG_Z = hi | lo;
			FLAG_V = VFLAG_CLEAR;
			return;
		}

		REG_D[(word2 >> 12) & 7] = lo;
		FLAG_N = NFLAG_32(lo);
		FLAG_Z = lo;
		if(BIT_B(word2))
			FLAG_V = (!((GET_MSB_32(lo) && hi == 0xffffffff) || (!GET_MSB_32(lo) && !hi)))<<7;
		else
			FLAG_V = (hi != 0) << 7;
		return;
	}
	m68ki_exception_illegal();

#endif
}